

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itread.c
# Opt level: O0

int it_read_sample_header(IT_SAMPLE *sample,uchar *convert,int32 *offset,DUMBFILE *f)

{
  bool bVar1;
  int32 iVar2;
  uint uVar3;
  int iVar4;
  DUMBFILE *in_RCX;
  int32 *in_RDX;
  char *in_RSI;
  long in_RDI;
  int32 s;
  int hax;
  DUMBFILE *in_stack_ffffffffffffffc8;
  
  bVar1 = false;
  iVar2 = dumbfile_mgetl(in_stack_ffffffffffffffc8);
  if ((iVar2 != 0x494d5053) && (iVar2 == 0x494d)) {
    uVar3 = dumbfile_mgetw(in_stack_ffffffffffffffc8);
    if ((uVar3 | 0x494d0000) != 0x494d5053) {
      return -1;
    }
    bVar1 = true;
  }
  dumbfile_getnc(in_RSI,(int32)((ulong)in_RDX >> 0x20),in_RCX);
  *(undefined1 *)(in_RDI + 0x30) = 0;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x33) = (char)iVar4;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x32) = (char)iVar4;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x34) = (char)iVar4;
  dumbfile_getnc(in_RSI,(int32)((ulong)in_RDX >> 0x20),in_RCX);
  *(undefined1 *)(in_RDI + 0x1a) = 0;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *in_RSI = (char)iVar4;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x35) = (char)iVar4;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x38) = iVar2;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x3c) = iVar2;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x40) = iVar2;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x44) = iVar2;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x48) = iVar2;
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *(int32 *)(in_RDI + 0x4c) = iVar2;
  if ((*(byte *)(in_RDI + 0x32) & 1) != 0) {
    if (*(int *)(in_RDI + 0x38) < 1) {
      *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xfe;
    }
    else {
      if (*(uint *)(in_RDI + 0x38) < *(uint *)(in_RDI + 0x40)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xef;
      }
      else if (*(uint *)(in_RDI + 0x40) <= *(uint *)(in_RDI + 0x3c)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xef;
      }
      if (*(uint *)(in_RDI + 0x38) < *(uint *)(in_RDI + 0x4c)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xdf;
      }
      else if (*(uint *)(in_RDI + 0x4c) <= *(uint *)(in_RDI + 0x48)) {
        *(byte *)(in_RDI + 0x32) = *(byte *)(in_RDI + 0x32) & 0xdf;
      }
      if (((*(byte *)(in_RDI + 0x32) & 0x10) != 0) && (*in_RSI != -1)) {
        if (((*(byte *)(in_RDI + 0x32) & 0x20) == 0) ||
           (*(int *)(in_RDI + 0x4c) < *(int *)(in_RDI + 0x40))) {
          *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x40);
        }
        else {
          *(undefined4 *)(in_RDI + 0x38) = *(undefined4 *)(in_RDI + 0x4c);
        }
      }
    }
  }
  iVar2 = dumbfile_igetl(in_stack_ffffffffffffffc8);
  *in_RDX = iVar2;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x50) = (char)iVar4;
  iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
  *(char *)(in_RDI + 0x51) = (char)iVar4;
  if (bVar1) {
    *(undefined1 *)(in_RDI + 0x52) = 0;
    *(undefined1 *)(in_RDI + 0x53) = 0;
  }
  else {
    iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
    *(char *)(in_RDI + 0x52) = (char)iVar4;
    iVar4 = dumbfile_getc(in_stack_ffffffffffffffc8);
    *(char *)(in_RDI + 0x53) = (char)iVar4;
  }
  *(undefined2 *)(in_RDI + 0x54) = 0;
  *(undefined4 *)(in_RDI + 0x60) = 0xffffffff;
  iVar4 = dumbfile_error(in_RCX);
  return iVar4;
}

Assistant:

static int it_read_sample_header(IT_SAMPLE *sample, unsigned char *convert, int32 *offset, DUMBFILE *f)
{
	/* XXX
	if (dumbfile_mgetl(f) != IT_SAMPLE_SIGNATURE)
		return -1;*/
	int hax = 0;
	int32 s = dumbfile_mgetl(f);
	if (s != IT_SAMPLE_SIGNATURE) {
		if ( s == ( IT_SAMPLE_SIGNATURE >> 16 ) ) {
			s <<= 16;
			s |= dumbfile_mgetw(f);
			if ( s != IT_SAMPLE_SIGNATURE )
				return -1;
			hax = 1;
		}
	}

    dumbfile_getnc((char *)sample->filename, 13, f);
	sample->filename[13] = 0;

	sample->global_volume = dumbfile_getc(f);
	sample->flags = dumbfile_getc(f);
	sample->default_volume = dumbfile_getc(f);

    dumbfile_getnc((char *)sample->name, 26, f);
	sample->name[26] = 0;

	*convert = dumbfile_getc(f);
	sample->default_pan = dumbfile_getc(f);
	sample->length = dumbfile_igetl(f);
	sample->loop_start = dumbfile_igetl(f);
	sample->loop_end = dumbfile_igetl(f);
	sample->C5_speed = dumbfile_igetl(f);
	sample->sus_loop_start = dumbfile_igetl(f);
	sample->sus_loop_end = dumbfile_igetl(f);

#ifdef STEREO_SAMPLES_COUNT_AS_TWO
	if (sample->flags & IT_SAMPLE_STEREO) {
		sample->length >>= 1;
		sample->loop_start >>= 1;
		sample->loop_end >>= 1;
		sample->C5_speed >>= 1;
		sample->sus_loop_start >>= 1;
		sample->sus_loop_end >>= 1;
	}
#endif

	if (sample->flags & IT_SAMPLE_EXISTS) {
		if (sample->length <= 0)
			sample->flags &= ~IT_SAMPLE_EXISTS;
		else {
			if ((unsigned int)sample->loop_end > (unsigned int)sample->length)
				sample->flags &= ~IT_SAMPLE_LOOP;
			else if ((unsigned int)sample->loop_start >= (unsigned int)sample->loop_end)
				sample->flags &= ~IT_SAMPLE_LOOP;

			if ((unsigned int)sample->sus_loop_end > (unsigned int)sample->length)
				sample->flags &= ~IT_SAMPLE_SUS_LOOP;
			else if ((unsigned int)sample->sus_loop_start >= (unsigned int)sample->sus_loop_end)
				sample->flags &= ~IT_SAMPLE_SUS_LOOP;

			/* We may be able to truncate the sample to save memory. */
			if (sample->flags & IT_SAMPLE_LOOP &&
				*convert != 0xFF) { /* not truncating compressed samples, for now... */
				if ((sample->flags & IT_SAMPLE_SUS_LOOP) && sample->sus_loop_end >= sample->loop_end)
					sample->length = sample->sus_loop_end;
				else
					sample->length = sample->loop_end;
			}
		}
	}

	*offset = dumbfile_igetl(f);

	sample->vibrato_speed = dumbfile_getc(f);
	sample->vibrato_depth = dumbfile_getc(f);
	if ( ! hax ) {
		sample->vibrato_rate = dumbfile_getc(f);
		sample->vibrato_waveform = dumbfile_getc(f);
	} else {
		sample->vibrato_rate = 0;
		sample->vibrato_waveform = 0;
	}
	sample->finetune = 0;
	sample->max_resampling_quality = -1;

	return dumbfile_error(f);
}